

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void container_printf_as_uint32_array(container_t *c,uint8_t typecode,uint32_t base)

{
  array_container_t *v;
  uint8_t local_11;
  
  local_11 = typecode;
  v = (array_container_t *)container_unwrap_shared(c,&local_11);
  if (local_11 == '\x03') {
    run_container_printf_as_uint32_array((run_container_t *)v,base);
    return;
  }
  if (local_11 == '\x02') {
    array_container_printf_as_uint32_array(v,base);
    return;
  }
  bitset_container_printf_as_uint32_array((bitset_container_t *)v,base);
  return;
}

Assistant:

void container_printf_as_uint32_array(
    const container_t *c, uint8_t typecode,
    uint32_t base
){
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_printf_as_uint32_array(
                const_CAST_bitset(c), base);
            return;
        case ARRAY_CONTAINER_TYPE:
            array_container_printf_as_uint32_array(
                const_CAST_array(c), base);
            return;
        case RUN_CONTAINER_TYPE:
            run_container_printf_as_uint32_array(
                const_CAST_run(c), base);
            return;
        default:
            __builtin_unreachable();
    }
}